

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

string * __thiscall NDeviceChannel::getId_abi_cxx11_(NDeviceChannel *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string NDeviceChannel::getId() const
{
    return id;
}